

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void write_modes_sb(AV1_COMP *cpi,ThreadData_conflict *td,TileInfo *tile,aom_writer *w,
                   TokenExtra **tok,TokenExtra *tok_end,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  aom_cdf_prob *icdf;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  RestorationType RVar6;
  RestorationType s;
  MB_MODE_INFO **ppMVar7;
  RestorationUnitInfo *pRVar8;
  FRAME_CONTEXT *pFVar9;
  bool bVar10;
  ThreadData_conflict *pTVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  byte bVar16;
  short sVar17;
  aom_writer *paVar18;
  TileInfo *pTVar19;
  RestorationUnitInfo **__n;
  int iVar20;
  aom_cdf_prob (*icdf_00) [11];
  TokenExtra *pTVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  AV1_COMP *pAVar26;
  TokenExtra **tok_00;
  uint uVar27;
  undefined8 in_R11;
  undefined7 uVar28;
  long lVar29;
  BLOCK_SIZE BVar30;
  int rcol0;
  int rrow1;
  int rcol1;
  int rrow0;
  int *in_stack_fffffffffffffef0;
  BLOCK_SIZE BVar31;
  int *in_stack_fffffffffffffef8;
  uint local_fc;
  aom_writer *local_f8;
  TokenExtra *local_f0;
  TokenExtra **local_e8;
  uint8_t local_dd;
  uint local_dc;
  ulong local_d8;
  ulong local_d0;
  RestorationUnitInfo **local_c8;
  AV1_COMP *local_c0;
  ThreadData_conflict *local_b8;
  od_ec_enc *local_b0;
  RestorationInfo *local_a8;
  TileInfo *local_a0;
  uint local_98;
  int local_94;
  int local_90;
  int local_8c;
  ulong local_88;
  long local_80;
  int local_74;
  RestorationInfo *local_70;
  SgrprojInfo *local_68;
  WienerInfo *local_60;
  ulong local_58;
  SgrprojInfo *local_50;
  WienerInfo *local_48;
  AV1Common *local_40;
  long local_38;
  
  local_d0 = (ulong)(BLOCK_SIZE)mi_col;
  bVar16 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[local_d0];
  local_58 = (ulong)bVar16;
  local_d8 = (ulong)(bVar16 >> 1);
  iVar13 = (cpi->common).mi_params.mi_rows;
  BVar30 = BLOCK_INVALID;
  uVar28 = (undefined7)((ulong)in_R11 >> 8);
  local_dc = (uint)CONCAT71(uVar28,0xff);
  iVar20 = (int)tok_end;
  if (iVar20 < iVar13) {
    iVar14 = (cpi->common).mi_params.mi_cols;
    local_dc = (uint)CONCAT71(uVar28,0xff);
    if (mi_row < iVar14) {
      iVar25 = (cpi->common).mi_params.mi_stride;
      iVar12 = iVar25 * iVar20 + mi_row;
      ppMVar7 = (cpi->common).mi_params.mi_grid_base;
      BVar31 = ppMVar7[iVar12]->bsize;
      if (BVar31 == (BLOCK_SIZE)mi_col) {
        local_dc = 0;
      }
      else {
        bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                [local_d0];
        bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar31]
        ;
        bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar31]
        ;
        if ((((BLOCK_SIZE)mi_col < BLOCK_8X16) || (iVar13 <= (int)((uint)(bVar16 >> 1) + iVar20)))
           || (iVar14 <= (int)((uint)(bVar1 >> 1) + mi_row))) {
          local_dc = (uint)CONCAT71((int7)((ulong)ppMVar7 >> 8),
                                    *(undefined1 *)
                                     ((long)&get_partition_base_partitions +
                                     (ulong)(bVar2 < bVar1) + (ulong)(bVar3 < bVar16) * 2));
        }
        else {
          ppMVar7 = ppMVar7 + iVar12;
          uVar28 = (undefined7)((ulong)ppMVar7 >> 8);
          if (bVar3 == bVar16) {
            local_dc = (uint)CONCAT71(uVar28,8);
            if ((uint)bVar2 << 2 != (uint)bVar1) {
              local_dc = (uint)CONCAT71(uVar28,(ppMVar7[(int)((uint)(bVar1 >> 1) * iVar25)]->bsize
                                               != BVar31) * '\x04' + '\x01');
            }
          }
          else if (bVar2 == bVar1) {
            local_dc = (uint)CONCAT71(uVar28,9);
            if ((uint)bVar3 << 2 != (uint)bVar16) {
              local_dc = (uint)(ppMVar7[local_d8]->bsize != BVar31) * 5 + 2;
            }
          }
          else {
            local_dc = (uint)CONCAT71(uVar28,3);
            if (((uint)bVar2 * 2 == (uint)bVar1 && (uint)bVar3 * 2 == (uint)bVar16) &&
               (local_dc = (uint)CONCAT71(uVar28,4),
               "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
               [ppMVar7[(int)((uint)(bVar1 >> 1) * iVar25)]->bsize] != bVar16)) {
              local_dc = (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                [ppMVar7[local_d8]->bsize] == bVar1) * 3 + 3;
            }
          }
        }
      }
    }
  }
  if ((char)local_dc == -1) goto LAB_001941cb;
  switch(local_d0) {
  case 0:
    bVar10 = false;
    uVar15 = local_d0;
    goto LAB_001941b0;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_00194168_caseD_1:
    bVar10 = true;
    uVar15 = 6;
    goto LAB_001941b0;
  case 3:
    uVar15 = 1;
    break;
  case 6:
    uVar15 = 2;
    break;
  case 9:
    uVar15 = 3;
    break;
  default:
    if ((mi_col & 0xffU) == 0xc) {
      uVar15 = 4;
    }
    else {
      if ((mi_col & 0xffU) != 0xf) goto switchD_00194168_caseD_1;
      uVar15 = 5;
    }
  }
  bVar10 = false;
LAB_001941b0:
  if (!bVar10) {
    BVar30 = subsize_lookup[local_dc & 0xff][uVar15];
  }
LAB_001941cb:
  if ((cpi->common).mi_params.mi_rows <= iVar20) {
    return;
  }
  if ((cpi->common).mi_params.mi_cols <= mi_row) {
    return;
  }
  local_40 = &cpi->common;
  local_98 = (uint)(bVar16 >> 2);
  local_dd = ((cpi->common).seq_params)->monochrome;
  local_70 = (cpi->common).rst_info;
  local_48 = (td->mb).e_mbd.wiener_info;
  local_50 = (td->mb).e_mbd.sgrproj_info;
  local_b0 = &w->ec;
  uVar15 = 0;
  local_f8 = w;
  local_f0 = tok_end;
  local_e8 = tok;
  local_c0 = cpi;
  local_b8 = td;
  local_a0 = tile;
  do {
    local_88 = uVar15;
    if (local_70[uVar15].frame_restoration_type != RESTORE_NONE) {
      in_stack_fffffffffffffef8 = &local_90;
      in_stack_fffffffffffffef0 = &local_74;
      iVar13 = av1_loop_restoration_corners_in_sb
                         (local_40,(int)uVar15,(int)local_f0,mi_row,(BLOCK_SIZE)local_d0,
                          (int *)&local_fc,&local_8c,in_stack_fffffffffffffef0,
                          in_stack_fffffffffffffef8);
      if ((iVar13 != 0) && (local_80 = (long)local_74, local_74 < local_90)) {
        local_a8 = local_70 + uVar15;
        local_38 = (long)local_a8->horz_units;
        local_c8 = &local_70[uVar15].unit_info;
        local_94 = (uint)(local_88 == 0) * 2 + 5;
        local_60 = local_48 + local_88;
        local_68 = local_50 + local_88;
        do {
          lVar23 = (long)(int)local_fc;
          if ((int)local_fc < local_8c) {
            lVar29 = local_80 * local_38;
            do {
              pRVar8 = *local_c8;
              RVar6 = local_a8->frame_restoration_type;
              s = pRVar8[lVar23 + lVar29].restoration_type;
              if (RVar6 == RESTORE_WIENER) {
                pFVar9 = (td->mb).e_mbd.tile_ctx;
                od_ec_encode_cdf_q15
                          (local_b0,(uint)(s != RESTORE_NONE),pFVar9->wiener_restore_cdf,2);
                if (local_f8->allow_update_cdf != '\0') {
                  uVar4 = pFVar9->wiener_restore_cdf[2];
                  bVar16 = (char)(uVar4 >> 4) + 4;
                  uVar5 = pFVar9->wiener_restore_cdf[0];
                  if (s == RESTORE_NONE) {
                    sVar17 = -(uVar5 >> (bVar16 & 0x1f));
                  }
                  else {
                    sVar17 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
                  }
                  pFVar9->wiener_restore_cdf[0] = sVar17 + uVar5;
                  pFVar9->wiener_restore_cdf[2] = uVar4 + (uVar4 < 0x20);
                }
                if (s != RESTORE_NONE) {
LAB_001945cb:
                  write_wiener_filter(local_94,&pRVar8[lVar23 + lVar29].wiener_info,local_60,
                                      local_f8);
                }
              }
              else if (RVar6 == RESTORE_SGRPROJ) {
                pFVar9 = (td->mb).e_mbd.tile_ctx;
                od_ec_encode_cdf_q15
                          (local_b0,(uint)(s != RESTORE_NONE),pFVar9->sgrproj_restore_cdf,2);
                if (local_f8->allow_update_cdf != '\0') {
                  uVar4 = pFVar9->sgrproj_restore_cdf[2];
                  bVar16 = (char)(uVar4 >> 4) + 4;
                  uVar5 = pFVar9->sgrproj_restore_cdf[0];
                  if (s == RESTORE_NONE) {
                    sVar17 = -(uVar5 >> (bVar16 & 0x1f));
                  }
                  else {
                    sVar17 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
                  }
                  pFVar9->sgrproj_restore_cdf[0] = sVar17 + uVar5;
                  pFVar9->sgrproj_restore_cdf[2] = uVar4 + (uVar4 < 0x20);
                }
                if (s != RESTORE_NONE) {
                  write_sgrproj_filter(&pRVar8[lVar23 + lVar29].sgrproj_info,local_68,local_f8);
                }
              }
              else if (RVar6 == RESTORE_SWITCHABLE) {
                pFVar9 = (td->mb).e_mbd.tile_ctx;
                icdf = pFVar9->switchable_restore_cdf;
                od_ec_encode_cdf_q15(local_b0,s,icdf,3);
                if (local_f8->allow_update_cdf != '\0') {
                  uVar4 = pFVar9->switchable_restore_cdf[3];
                  bVar16 = (char)(uVar4 >> 4) + 4;
                  lVar24 = 0;
                  do {
                    uVar5 = icdf[lVar24];
                    if (lVar24 < (char)s) {
                      sVar17 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
                    }
                    else {
                      sVar17 = -(uVar5 >> (bVar16 & 0x1f));
                    }
                    icdf[lVar24] = sVar17 + uVar5;
                    lVar24 = lVar24 + 1;
                  } while (lVar24 != 2);
                  pFVar9->switchable_restore_cdf[3] =
                       pFVar9->switchable_restore_cdf[3] + (ushort)(uVar4 < 0x20);
                }
                if (s == RESTORE_SGRPROJ) {
                  write_sgrproj_filter(&pRVar8[lVar23 + lVar29].sgrproj_info,local_68,local_f8);
                  td = local_b8;
                }
                else {
                  td = local_b8;
                  if (s == RESTORE_WIENER) goto LAB_001945cb;
                }
              }
              lVar23 = lVar23 + 1;
            } while (lVar23 < local_8c);
          }
          local_80 = local_80 + 1;
        } while (local_80 < local_90);
      }
    }
    pAVar26 = local_c0;
    BVar31 = (BLOCK_SIZE)in_stack_fffffffffffffef8;
  } while ((local_dd == '\0') && (uVar15 = local_88 + 1, local_88 < 2));
  if (BLOCK_8X4 < (BLOCK_SIZE)mi_col) {
    iVar14 = (int)local_d8 + (uint)local_f0;
    iVar13 = (local_c0->common).mi_params.mi_rows;
    iVar20 = (local_c0->common).mi_params.mi_cols;
    iVar25 = (int)local_d8 + mi_row;
    lVar23 = (ulong)""[local_d0] - 1;
    if (iVar25 < iVar20 || iVar14 < iVar13) {
      lVar23 = (ulong)((uint)(((uint)(int)(td->mb).e_mbd.above_partition_context[mi_row] >>
                               ((uint)lVar23 & 0x1f) & 1) != 0) +
                      ((uint)(int)(td->mb).e_mbd.left_partition_context[(uint)local_f0 & 0x1f] >>
                       ((byte)lVar23 & 0x1f) & 1) * 2) + (ulong)""[local_d0] * 4;
      iVar12 = (int)lVar23 + -4;
      pFVar9 = (td->mb).e_mbd.tile_ctx;
      if (iVar14 < iVar13 && iVar25 < iVar20) {
        icdf_00 = pFVar9->partition_cdf + lVar23 + -4;
        uVar27 = 4;
        if ((BLOCK_SIZE)mi_col != BLOCK_8X8) {
          uVar27 = ((BLOCK_SIZE)mi_col != BLOCK_128X128) + 8 +
                   (uint)((BLOCK_SIZE)mi_col != BLOCK_128X128);
        }
        od_ec_encode_cdf_q15(local_b0,local_dc & 0xff,*icdf_00,uVar27);
        if (local_f8->allow_update_cdf != '\0') {
          uVar4 = (*icdf_00)[uVar27];
          bVar16 = (char)(uVar4 >> 4) + 5;
          uVar15 = 0;
          do {
            uVar5 = (*icdf_00)[uVar15];
            if ((long)uVar15 < (long)(char)local_dc) {
              sVar17 = (short)((int)(0x8000 - (uint)uVar5) >> (bVar16 & 0x1f));
            }
            else {
              sVar17 = -(uVar5 >> (bVar16 & 0x1f));
            }
            (*icdf_00)[uVar15] = sVar17 + uVar5;
            uVar15 = uVar15 + 1;
          } while (uVar27 - 1 != uVar15);
          (*icdf_00)[uVar27] = (*icdf_00)[uVar27] + (ushort)(uVar4 < 0x20);
        }
      }
      else {
        if (iVar14 < iVar13 || iVar20 <= iVar25) {
          sVar17 = (pFVar9->partition_cdf[iVar12][6] - pFVar9->partition_cdf[iVar12][5]) +
                   (pFVar9->partition_cdf[iVar12][5] - pFVar9->partition_cdf[iVar12][4]) +
                   (pFVar9->partition_cdf[iVar12][4] - pFVar9->partition_cdf[iVar12][3]) +
                   (pFVar9->partition_cdf[iVar12][3] - pFVar9->partition_cdf[iVar12][2]) +
                   (pFVar9->partition_cdf[iVar12][1] - pFVar9->partition_cdf[iVar12][0] ^ 0x8000);
          if ((BLOCK_SIZE)mi_col != BLOCK_128X128) {
            sVar17 = (sVar17 - pFVar9->partition_cdf[iVar12][7]) + pFVar9->partition_cdf[iVar12][8];
          }
        }
        else {
          sVar17 = (pFVar9->partition_cdf[iVar12][7] - pFVar9->partition_cdf[iVar12][6]) +
                   (pFVar9->partition_cdf[iVar12][6] - pFVar9->partition_cdf[iVar12][5]) +
                   (pFVar9->partition_cdf[iVar12][4] - pFVar9->partition_cdf[iVar12][3]) +
                   (pFVar9->partition_cdf[iVar12][3] - pFVar9->partition_cdf[iVar12][2]) +
                   (pFVar9->partition_cdf[iVar12][2] - pFVar9->partition_cdf[iVar12][1] ^ 0x8000);
          if ((BLOCK_SIZE)mi_col != BLOCK_128X128) {
            sVar17 = (sVar17 - pFVar9->partition_cdf[iVar12][8]) + pFVar9->partition_cdf[iVar12][9];
          }
        }
        local_fc = (uint)(ushort)(0x8000 - sVar17);
        od_ec_encode_cdf_q15(local_b0,(uint)((char)local_dc == '\x03'),(uint16_t *)&local_fc,2);
      }
    }
  }
  pTVar19 = local_a0;
  tok_00 = local_e8;
  pTVar21 = local_f0;
  paVar18 = local_f8;
  iVar14 = (int)in_stack_fffffffffffffef0;
  local_a8 = (RestorationInfo *)(ulong)(local_dc & 0xff);
  iVar20 = (int)local_f0;
  iVar13 = mi_row;
  switch(local_a8) {
  case (RestorationInfo *)0x0:
    goto LAB_00194d0d;
  case (RestorationInfo *)0x1:
    write_modes_b(pAVar26,td,local_a0,local_f8,local_e8,(TokenExtra *)((ulong)local_f0 & 0xffffffff)
                  ,mi_row,iVar14);
    uVar27 = (int)local_d8 + iVar20;
    paVar18 = local_f8;
    tok_00 = local_e8;
    pTVar21 = (TokenExtra *)(ulong)uVar27;
    if ((int)uVar27 < (pAVar26->common).mi_params.mi_rows) goto LAB_00194d0d;
    break;
  case (RestorationInfo *)0x2:
    write_modes_b(pAVar26,td,local_a0,local_f8,local_e8,local_f0,mi_row,iVar14);
    iVar13 = (int)local_d8 + mi_row;
    paVar18 = local_f8;
    tok_00 = local_e8;
    pTVar21 = local_f0;
    if (iVar13 < (pAVar26->common).mi_params.mi_cols) goto LAB_00194d0d;
    break;
  case (RestorationInfo *)0x3:
    local_c8 = (RestorationUnitInfo **)CONCAT44(local_c8._4_4_,(uint)BVar30);
    write_modes_sb(pAVar26,td,local_a0,local_f8,local_e8,
                   (TokenExtra *)((ulong)local_f0 & 0xffffffff),mi_row,(uint)BVar30,BVar31);
    iVar13 = (int)local_d8;
    iVar25 = iVar13 + mi_row;
    local_b0 = (od_ec_enc *)CONCAT44(local_b0._4_4_,iVar25);
    iVar14 = (int)local_c8;
    write_modes_sb(local_c0,td,local_a0,paVar18,tok_00,(TokenExtra *)((ulong)pTVar21 & 0xffffffff),
                   iVar25,(int)local_c8,BVar31);
    pTVar19 = local_a0;
    pAVar26 = local_c0;
    uVar27 = iVar13 + iVar20;
    write_modes_sb(local_c0,td,local_a0,paVar18,tok_00,(TokenExtra *)(ulong)uVar27,mi_row,iVar14,
                   BVar31);
    write_modes_sb(pAVar26,td,pTVar19,paVar18,tok_00,(TokenExtra *)(ulong)uVar27,(int)local_b0,
                   (int)local_c8,BVar31);
    break;
  case (RestorationInfo *)0x4:
    write_modes_b(pAVar26,td,local_a0,local_f8,local_e8,(TokenExtra *)((ulong)local_f0 & 0xffffffff)
                  ,mi_row,iVar14);
    tok_00 = local_e8;
    iVar25 = (int)local_d8;
    write_modes_b(pAVar26,td,pTVar19,paVar18,local_e8,(TokenExtra *)((ulong)pTVar21 & 0xffffffff),
                  mi_row + iVar25,iVar14);
    pTVar19 = local_a0;
    pTVar21 = (TokenExtra *)(ulong)(uint)(iVar25 + iVar20);
    goto LAB_00194d0d;
  case (RestorationInfo *)0x5:
    write_modes_b(pAVar26,td,local_a0,local_f8,local_e8,(TokenExtra *)((ulong)local_f0 & 0xffffffff)
                  ,mi_row,iVar14);
    pAVar26 = local_c0;
    iVar13 = (int)local_d8;
    uVar27 = iVar13 + iVar20;
    local_c8 = (RestorationUnitInfo **)CONCAT44(local_c8._4_4_,uVar27);
    write_modes_b(local_c0,td,pTVar19,paVar18,tok_00,(TokenExtra *)(ulong)uVar27,mi_row,iVar14);
    iVar13 = iVar13 + mi_row;
    pTVar21 = (TokenExtra *)((ulong)local_c8 & 0xffffffff);
    goto LAB_00194d0d;
  case (RestorationInfo *)0x6:
    write_modes_b(pAVar26,td,local_a0,local_f8,local_e8,(TokenExtra *)((ulong)local_f0 & 0xffffffff)
                  ,mi_row,iVar14);
    tok_00 = local_e8;
    iVar13 = (int)local_d8;
    write_modes_b(pAVar26,td,pTVar19,paVar18,local_e8,(TokenExtra *)(ulong)(uint)(iVar13 + iVar20),
                  mi_row,iVar14);
    iVar13 = iVar13 + mi_row;
    pTVar19 = local_a0;
    pTVar21 = (TokenExtra *)((ulong)pTVar21 & 0xffffffff);
    goto LAB_00194d0d;
  case (RestorationInfo *)0x7:
    write_modes_b(pAVar26,td,local_a0,local_f8,local_e8,(TokenExtra *)((ulong)local_f0 & 0xffffffff)
                  ,mi_row,iVar14);
    tok_00 = local_e8;
    iVar25 = (int)local_d8;
    iVar13 = mi_row + iVar25;
    local_c8 = (RestorationUnitInfo **)CONCAT44(local_c8._4_4_,iVar13);
    write_modes_b(pAVar26,td,pTVar19,paVar18,local_e8,(TokenExtra *)((ulong)pTVar21 & 0xffffffff),
                  iVar13,iVar14);
    pAVar26 = local_c0;
    pTVar21 = (TokenExtra *)(ulong)(uint)(iVar25 + iVar20);
    iVar13 = (int)local_c8;
LAB_00194d0d:
    write_modes_b(pAVar26,td,pTVar19,paVar18,tok_00,pTVar21,iVar13,iVar14);
    break;
  case (RestorationInfo *)0x8:
    iVar13 = 4;
    pTVar21 = (TokenExtra *)((ulong)local_f0 & 0xffffffff);
    do {
      if ((iVar13 != 4) && ((pAVar26->common).mi_params.mi_rows <= (int)pTVar21)) break;
      write_modes_b(pAVar26,td,pTVar19,local_f8,local_e8,pTVar21,mi_row,
                    (int)in_stack_fffffffffffffef0);
      pTVar21 = (TokenExtra *)(ulong)((int)pTVar21 + local_98);
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    break;
  case (RestorationInfo *)0x9:
    iVar20 = 4;
    do {
      if ((iVar20 != 4) && ((pAVar26->common).mi_params.mi_cols <= iVar13)) break;
      write_modes_b(pAVar26,td,pTVar19,local_f8,local_e8,local_f0,iVar13,
                    (int)in_stack_fffffffffffffef0);
      iVar13 = iVar13 + local_98;
      iVar20 = iVar20 + -1;
    } while (iVar20 != 0);
  }
  pTVar11 = local_b8;
  if ((BLOCK_SIZE)mi_col < BLOCK_8X8) {
    return;
  }
  if ((BLOCK_SIZE)mi_col < BLOCK_32X64) {
    (*(code *)(&DAT_004d4890 + *(int *)(&DAT_004d4890 + local_d0 * 4)))();
    return;
  }
  if ((int)local_d0 == 0xc) {
    lVar23 = 4;
  }
  else {
    if ((int)local_d0 != 0xf) {
      lVar23 = 6;
      bVar10 = true;
      goto LAB_00194e2b;
    }
    lVar23 = 5;
  }
  bVar10 = false;
LAB_00194e2b:
  uVar15 = 0xff;
  if (!bVar10) {
    uVar15 = (ulong)subsize_lookup[3][lVar23];
  }
  if ((byte)local_dc < 10) {
    uVar22 = (uint)((byte)((local_58 & 0xffffffff) >> 1) & 0x7f);
    uVar27 = (uint)local_f0;
    switch((long)&switchD_00194e62::switchdataD_004d48b8 +
           (long)(int)(&switchD_00194e62::switchdataD_004d48b8)[(long)local_a8]) {
    case 0x194ed8:
      if ((BLOCK_SIZE)mi_col != BLOCK_8X8) {
        return;
      }
    case 0x194e64:
      paVar18 = (aom_writer *)((local_b8->mb).e_mbd.left_partition_context + (uVar27 & 0x1f));
      __n = (RestorationUnitInfo **)
            (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [local_d0];
      memset((local_b8->mb).e_mbd.above_partition_context + mi_row,
             (uint)(byte)partition_context_lookup[BVar30].above,local_58);
      uVar27 = (uint)(byte)partition_context_lookup[BVar30].left;
      break;
    case 0x194ee4:
      local_f8 = (aom_writer *)((local_b8->mb).e_mbd.left_partition_context + (uVar27 & 0x1f));
      bVar16 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar30];
      __n = (RestorationUnitInfo **)
            (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [BVar30];
      memset((local_b8->mb).e_mbd.above_partition_context + mi_row,
             (uint)(byte)partition_context_lookup[BVar30].above,(ulong)bVar16);
      paVar18 = local_f8;
      memset(local_f8,(uint)(byte)partition_context_lookup[BVar30].left,(size_t)__n);
      memset((pTVar11->mb).e_mbd.above_partition_context + (int)(uVar22 + mi_row),
             (uint)(byte)partition_context_lookup[uVar15].above,(ulong)bVar16);
      uVar27 = (uint)(byte)partition_context_lookup[uVar15].left;
      break;
    case 0x194f94:
      local_a8 = (RestorationInfo *)((local_b8->mb).e_mbd.left_partition_context + (uVar27 & 0x1f));
      local_f8 = (aom_writer *)
                 (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                        [BVar30];
      __n = (RestorationUnitInfo **)
            (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [BVar30];
      memset((local_b8->mb).e_mbd.above_partition_context + mi_row,
             (uint)(byte)partition_context_lookup[BVar30].above,(size_t)local_f8);
      memset(local_a8,(uint)(byte)partition_context_lookup[BVar30].left,(size_t)__n);
      paVar18 = (aom_writer *)
                ((pTVar11->mb).e_mbd.left_partition_context + (uVar22 + (int)local_f0 & 0x1f));
      memset((pTVar11->mb).e_mbd.above_partition_context + mi_row,
             (uint)(byte)partition_context_lookup[uVar15].above,(size_t)local_f8);
      uVar27 = (uint)(byte)partition_context_lookup[uVar15].left;
      break;
    case 0x195054:
      local_a8 = (RestorationInfo *)((local_b8->mb).e_mbd.left_partition_context + (uVar27 & 0x1f));
      local_f8 = (aom_writer *)
                 (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                        [BVar30];
      local_c8 = (RestorationUnitInfo **)
                 (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                        [BVar30];
      memset((local_b8->mb).e_mbd.above_partition_context + mi_row,
             (uint)(byte)partition_context_lookup[uVar15].above,(size_t)local_f8);
      __n = local_c8;
      memset(local_a8,(uint)(byte)partition_context_lookup[uVar15].left,(size_t)local_c8);
      paVar18 = (aom_writer *)
                ((pTVar11->mb).e_mbd.left_partition_context + (uVar22 + uVar27 & 0x1f));
      memset((pTVar11->mb).e_mbd.above_partition_context + mi_row,
             (uint)(byte)partition_context_lookup[BVar30].above,(size_t)local_f8);
      uVar27 = (uint)(byte)partition_context_lookup[BVar30].left;
      break;
    case 0x195121:
      local_f8 = (aom_writer *)((local_b8->mb).e_mbd.left_partition_context + (uVar27 & 0x1f));
      bVar16 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[BVar30];
      __n = (RestorationUnitInfo **)
            (ulong)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [BVar30];
      memset((local_b8->mb).e_mbd.above_partition_context + mi_row,
             (uint)(byte)partition_context_lookup[uVar15].above,(ulong)bVar16);
      paVar18 = local_f8;
      memset(local_f8,(uint)(byte)partition_context_lookup[uVar15].left,(size_t)__n);
      memset((pTVar11->mb).e_mbd.above_partition_context + (int)(uVar22 + mi_row),
             (uint)(byte)partition_context_lookup[BVar30].above,(ulong)bVar16);
      uVar27 = (uint)(byte)partition_context_lookup[BVar30].left;
    }
    memset(paVar18,uVar27,(size_t)__n);
  }
  return;
}

Assistant:

static inline void write_modes_sb(AV1_COMP *const cpi, ThreadData *const td,
                                  const TileInfo *const tile,
                                  aom_writer *const w, const TokenExtra **tok,
                                  const TokenExtra *const tok_end, int mi_row,
                                  int mi_col, BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MACROBLOCKD *const xd = &td->mb.e_mbd;
  assert(bsize < BLOCK_SIZES_ALL);
  const int hbs = mi_size_wide[bsize] / 2;
  const int quarter_step = mi_size_wide[bsize] / 4;
  int i;
  const PARTITION_TYPE partition = get_partition(cm, mi_row, mi_col, bsize);
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);

  if (mi_row >= mi_params->mi_rows || mi_col >= mi_params->mi_cols) return;

#if !CONFIG_REALTIME_ONLY
  const int num_planes = av1_num_planes(cm);
  for (int plane = 0; plane < num_planes; ++plane) {
    int rcol0, rcol1, rrow0, rrow1;

    // Skip some unnecessary work if loop restoration is disabled
    if (cm->rst_info[plane].frame_restoration_type == RESTORE_NONE) continue;

    if (av1_loop_restoration_corners_in_sb(cm, plane, mi_row, mi_col, bsize,
                                           &rcol0, &rcol1, &rrow0, &rrow1)) {
      const int rstride = cm->rst_info[plane].horz_units;
      for (int rrow = rrow0; rrow < rrow1; ++rrow) {
        for (int rcol = rcol0; rcol < rcol1; ++rcol) {
          const int runit_idx = rcol + rrow * rstride;
          loop_restoration_write_sb_coeffs(cm, xd, runit_idx, w, plane,
                                           td->counts);
        }
      }
    }
  }
#endif

  write_partition(cm, xd, hbs, mi_row, mi_col, partition, bsize, w);
  switch (partition) {
    case PARTITION_NONE:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      break;
    case PARTITION_HORZ:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      if (mi_row + hbs < mi_params->mi_rows)
        write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      break;
    case PARTITION_VERT:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      if (mi_col + hbs < mi_params->mi_cols)
        write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      break;
    case PARTITION_SPLIT:
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row, mi_col, subsize);
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs,
                     subsize);
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col,
                     subsize);
      write_modes_sb(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col + hbs,
                     subsize);
      break;
    case PARTITION_HORZ_A:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      break;
    case PARTITION_HORZ_B:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col + hbs);
      break;
    case PARTITION_VERT_A:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      break;
    case PARTITION_VERT_B:
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, mi_col + hbs);
      write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row + hbs, mi_col + hbs);
      break;
    case PARTITION_HORZ_4:
      for (i = 0; i < 4; ++i) {
        int this_mi_row = mi_row + i * quarter_step;
        if (i > 0 && this_mi_row >= mi_params->mi_rows) break;

        write_modes_b(cpi, td, tile, w, tok, tok_end, this_mi_row, mi_col);
      }
      break;
    case PARTITION_VERT_4:
      for (i = 0; i < 4; ++i) {
        int this_mi_col = mi_col + i * quarter_step;
        if (i > 0 && this_mi_col >= mi_params->mi_cols) break;

        write_modes_b(cpi, td, tile, w, tok, tok_end, mi_row, this_mi_col);
      }
      break;
    default: assert(0);
  }

  // update partition context
  update_ext_partition_context(xd, mi_row, mi_col, subsize, bsize, partition);
}